

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O0

void __thiscall EOServer::ClearClientRejections(EOServer *this,connection_log_iterator it)

{
  pointer ppVar1;
  undefined8 uVar2;
  string local_40;
  int *local_20;
  int *rejections;
  EOServer *this_local;
  connection_log_iterator it_local;
  
  rejections = (int *)this;
  this_local = (EOServer *)
               it.super__Node_iterator_base<std::pair<const_IPAddress,_ConnectionLogEntry>,_true>.
               _M_cur;
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::operator->
                     ((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true> *
                      )&this_local);
  local_20 = &(ppVar1->second).rejections;
  if (1 < *local_20) {
    ppVar1 = std::__detail::
             _Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_IPAddress,_ConnectionLogEntry>,_false,_true>
                         *)&this_local);
    IPAddress::operator_cast_to_string(&local_40,&ppVar1->first);
    uVar2 = std::__cxx11::string::c_str();
    Console::Wrn("Connections from %s were rejected (%dx)",uVar2,(ulong)(uint)*local_20);
    std::__cxx11::string::~string((string *)&local_40);
    *local_20 = 0;
  }
  return;
}

Assistant:

void EOServer::ClearClientRejections(EOServer::connection_log_iterator it)
{
	int& rejections = it->second.rejections;

	if (rejections > 1)
	{
		Console::Wrn("Connections from %s were rejected (%dx)", std::string(it->first).c_str(), rejections);
		rejections = 0;
	}
}